

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_setmode.c
# Opt level: O3

int mpt_stream_setmode(mpt_stream *stream,int mode)

{
  mpt_decode_queue *pmVar1;
  mpt_encode_queue *pmVar2;
  mpt_data_decoder_t p_Var3;
  size_t sVar4;
  mpt_data_encoder_t p_Var5;
  uint uVar6;
  int *piVar7;
  
  if ((mode & 0xfU) == 0) {
    uVar6 = mpt_stream_flags(&stream->_info);
    if ((mode & 0x10U) == 0) {
      p_Var3 = (stream->_rd)._dec;
      if (p_Var3 != (mpt_data_decoder_t)0x0) {
        (*p_Var3)(&(stream->_rd)._state,(iovec *)0x0,0);
      }
      pmVar1 = &stream->_rd;
      sVar4 = (stream->_rd).data.max;
      if (sVar4 != 0) {
        if ((uVar6 & 0x40) == 0) {
          if ((uVar6 & 0x10) != 0) {
            free((pmVar1->data).base);
          }
        }
        else {
          munmap((pmVar1->data).base,sVar4);
        }
      }
      (stream->_rd).data.max = 0;
      (stream->_rd).data.off = 0;
      (pmVar1->data).base = (void *)0x0;
      (stream->_rd).data.len = 0;
    }
    else {
      mode = mode | uVar6 & 0x40;
    }
    if ((mode & 0x20U) == 0) {
      p_Var5 = (stream->_wd)._enc;
      if (p_Var5 != (mpt_data_encoder_t)0x0) {
        (*p_Var5)(&(stream->_wd)._state,(iovec *)0x0,(iovec *)0x0);
      }
      pmVar2 = &stream->_wd;
      sVar4 = (stream->_wd).data.max;
      if (sVar4 != 0) {
        if ((char)uVar6 < '\0') {
          munmap((pmVar2->data).base,sVar4);
        }
        else if ((uVar6 & 0x20) != 0) {
          free((pmVar2->data).base);
        }
      }
      (stream->_wd).data.max = 0;
      (stream->_wd).data.off = 0;
      (pmVar2->data).base = (void *)0x0;
      (stream->_wd).data.len = 0;
    }
    else {
      mode = mode | uVar6 & 0xa0;
    }
    (stream->_info)._fd = (long)mode | (stream->_info)._fd & 0xffffffffffffff03;
  }
  else {
    piVar7 = __errno_location();
    *piVar7 = 0x16;
    mode = 0xffffffff;
  }
  return mode;
}

Assistant:

extern int mpt_stream_setmode(MPT_STRUCT(stream) *stream, int mode)
{
	static const MPT_STRUCT(queue) qinit = MPT_QUEUE_INIT;
	int flags;
	
	if (mode & 0xf) {
		errno = EINVAL;
		return -1;
	}
	flags = mpt_stream_flags(&stream->_info);
	
	/* keep read queue */
	if (mode & (MPT_STREAMFLAG(ReadBuf))) {
		mode |= flags & (MPT_STREAMFLAG(ReadBuf) | MPT_STREAMFLAG(ReadMap));
	}
	/* clear read queue */
	else {
		if (stream->_rd._dec) {
			stream->_rd._dec(&stream->_rd._state, 0, 0);
		}
		if (stream->_rd.data.max) {
			if (flags & MPT_STREAMFLAG(ReadMap)) {
				munmap(stream->_rd.data.base, stream->_rd.data.max);
			}
			else if (flags & MPT_STREAMFLAG(ReadBuf)) {
				free(stream->_rd.data.base);
			}
		}
		/* invalidate read queue */
		stream->_rd.data = qinit;
	}
	/* keep write queue */
	if (mode & (MPT_STREAMFLAG(WriteBuf))) {
		mode |= flags & (MPT_STREAMFLAG(WriteBuf) | MPT_STREAMFLAG(WriteMap));
	}
	/* clear write queue */
	else {
		if (stream->_wd._enc) {
			stream->_wd._enc(&stream->_wd._state, 0, 0);
		}
		if (stream->_wd.data.max) {
			if (flags & MPT_STREAMFLAG(WriteMap)) {
				munmap(stream->_wd.data.base, stream->_wd.data.max);
			}
			else if (flags & MPT_STREAMFLAG(WriteBuf)) {
				free(stream->_wd.data.base);
			}
		}
		/* invalidate write queue */
		stream->_wd.data = qinit;
	}
	stream->_info._fd = (stream->_info._fd & ~0xfc) | mode;
	
	return mode;
}